

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyConcaveCollisionAlgorithm.cpp
# Opt level: O3

void __thiscall
btSoftBodyTriangleCallback::processTriangle
          (btSoftBodyTriangleCallback *this,btVector3 *triangle,int partId,int triangleIndex)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  btDispatcher *pbVar5;
  btIDebugDraw *pbVar6;
  btCollisionObject *pbVar7;
  btTriIndex *pbVar8;
  btCollisionShape *pbVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  int iVar15;
  btConvexHullShape *this_00;
  long *plVar16;
  undefined4 extraout_var_00;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  btHashKey<btTriIndex> triKey;
  btTriIndex triIndex;
  btCollisionObjectWrapper triBody;
  btCollisionObjectWrapper triBody_1;
  btCollisionObjectWrapper softBody;
  btHashKey<btTriIndex> local_104;
  btHashMap<btHashKey<btTriIndex>,_btTriIndex> *local_100;
  btTriIndex local_f8;
  undefined1 local_e8 [16];
  btSoftBody *local_d8;
  btTransform *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  btCollisionObject *local_b0;
  btTransform *local_a8;
  int local_a0;
  int local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined4 extraout_var;
  
  local_78._8_8_ = local_78._0_8_;
  pbVar5 = this->m_dispatcher;
  if ((this->m_dispatchInfoPtr != (btDispatcherInfo *)0x0) &&
     (pbVar6 = this->m_dispatchInfoPtr->m_debugDraw, pbVar6 != (btIDebugDraw *)0x0)) {
    uVar14 = (*pbVar6->_vptr_btIDebugDraw[0xe])();
    if ((uVar14 & 1) != 0) {
      local_98 = ZEXT816(0x3f8000003f800000);
      pbVar7 = this->m_triBody;
      pbVar6 = this->m_dispatchInfoPtr->m_debugDraw;
      fVar1 = triangle->m_floats[0];
      fVar2 = triangle->m_floats[1];
      fVar3 = triangle->m_floats[2];
      fVar17 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[0];
      fVar18 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[1];
      fVar19 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[2];
      fVar20 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[1];
      fVar21 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[0];
      fVar22 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[1];
      fVar23 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[2];
      fVar26 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[0];
      fVar27 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[2];
      uVar4 = *(undefined8 *)(pbVar7->m_worldTransform).m_origin.m_floats;
      fVar24 = (float)uVar4;
      fVar25 = (float)((ulong)uVar4 >> 0x20);
      fVar28 = (pbVar7->m_worldTransform).m_origin.m_floats[2];
      local_e8._4_4_ = fVar3 * fVar27 + fVar1 * fVar26 + fVar2 * fVar20 + fVar25;
      local_e8._0_4_ = fVar3 * fVar23 + fVar1 * fVar21 + fVar2 * fVar22 + fVar24;
      local_e8._8_4_ = fVar3 * fVar19 + fVar1 * fVar17 + fVar2 * fVar18 + fVar28;
      local_e8._12_4_ = 0;
      fVar1 = triangle[1].m_floats[0];
      fVar2 = triangle[1].m_floats[1];
      fVar3 = triangle[1].m_floats[2];
      local_c0._4_4_ = fVar3 * fVar27 + fVar1 * fVar26 + fVar2 * fVar20 + fVar25;
      local_c0._0_4_ = fVar3 * fVar23 + fVar1 * fVar21 + fVar2 * fVar22 + fVar24;
      local_c0._8_4_ = fVar19 * fVar3 + fVar17 * fVar1 + fVar18 * fVar2 + fVar28;
      local_c0._12_4_ = 0;
      (*pbVar6->_vptr_btIDebugDraw[4])(pbVar6,local_e8,local_c0,local_98);
      pbVar6 = this->m_dispatchInfoPtr->m_debugDraw;
      fVar1 = triangle[1].m_floats[0];
      fVar2 = triangle[1].m_floats[1];
      fVar3 = triangle[1].m_floats[2];
      fVar17 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[0];
      fVar18 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[1];
      fVar19 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[2];
      fVar20 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[1];
      fVar21 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[0];
      fVar22 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[1];
      fVar23 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[2];
      fVar26 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[0];
      fVar27 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[2];
      uVar4 = *(undefined8 *)(pbVar7->m_worldTransform).m_origin.m_floats;
      fVar24 = (float)uVar4;
      fVar25 = (float)((ulong)uVar4 >> 0x20);
      fVar28 = (pbVar7->m_worldTransform).m_origin.m_floats[2];
      local_e8._4_4_ = fVar3 * fVar27 + fVar1 * fVar26 + fVar2 * fVar20 + fVar25;
      local_e8._0_4_ = fVar3 * fVar23 + fVar1 * fVar21 + fVar2 * fVar22 + fVar24;
      local_e8._8_4_ = fVar3 * fVar19 + fVar1 * fVar17 + fVar2 * fVar18 + fVar28;
      local_e8._12_4_ = 0;
      fVar1 = triangle[2].m_floats[0];
      fVar2 = triangle[2].m_floats[1];
      fVar3 = triangle[2].m_floats[2];
      local_c0._4_4_ = fVar3 * fVar27 + fVar1 * fVar26 + fVar2 * fVar20 + fVar25;
      local_c0._0_4_ = fVar3 * fVar23 + fVar1 * fVar21 + fVar2 * fVar22 + fVar24;
      local_c0._8_4_ = fVar19 * fVar3 + fVar17 * fVar1 + fVar18 * fVar2 + fVar28;
      local_c0._12_4_ = 0;
      (*pbVar6->_vptr_btIDebugDraw[4])(pbVar6,local_e8,local_c0,local_98);
      pbVar6 = this->m_dispatchInfoPtr->m_debugDraw;
      fVar1 = triangle[2].m_floats[0];
      fVar2 = triangle[2].m_floats[1];
      fVar3 = triangle[2].m_floats[2];
      fVar17 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[0];
      fVar18 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[1];
      fVar19 = (pbVar7->m_worldTransform).m_basis.m_el[2].m_floats[2];
      fVar20 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[1];
      fVar21 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[0];
      fVar22 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[1];
      fVar23 = (pbVar7->m_worldTransform).m_basis.m_el[0].m_floats[2];
      fVar26 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[0];
      fVar27 = (pbVar7->m_worldTransform).m_basis.m_el[1].m_floats[2];
      uVar4 = *(undefined8 *)(pbVar7->m_worldTransform).m_origin.m_floats;
      fVar24 = (float)uVar4;
      fVar25 = (float)((ulong)uVar4 >> 0x20);
      fVar28 = (pbVar7->m_worldTransform).m_origin.m_floats[2];
      local_e8._4_4_ = fVar3 * fVar27 + fVar1 * fVar26 + fVar2 * fVar20 + fVar25;
      local_e8._0_4_ = fVar3 * fVar23 + fVar1 * fVar21 + fVar2 * fVar22 + fVar24;
      local_e8._8_4_ = fVar3 * fVar19 + fVar1 * fVar17 + fVar2 * fVar18 + fVar28;
      local_e8._12_4_ = 0;
      fVar1 = triangle->m_floats[0];
      fVar2 = triangle->m_floats[1];
      fVar3 = triangle->m_floats[2];
      local_c0._4_4_ = fVar3 * fVar27 + fVar1 * fVar26 + fVar2 * fVar20 + fVar25;
      local_c0._0_4_ = fVar3 * fVar23 + fVar1 * fVar21 + fVar2 * fVar22 + fVar24;
      local_c0._8_4_ = fVar19 * fVar3 + fVar17 * fVar1 + fVar18 * fVar2 + fVar28;
      local_c0._12_4_ = 0;
      (*pbVar6->_vptr_btIDebugDraw[4])(pbVar6,local_e8,local_c0,local_98);
    }
  }
  local_104.m_uid = partId << 0x15 | triangleIndex;
  local_f8.m_childShape = (btCollisionShape *)0x0;
  local_f8.m_PartIdTriangleIndex = local_104.m_uid;
  iVar15 = btHashMap<btHashKey<btTriIndex>,_btTriIndex>::findIndex(&this->m_shapeCache,&local_104);
  pbVar8 = (this->m_shapeCache).m_valueArray.m_data;
  if (pbVar8 == (btTriIndex *)0x0 || iVar15 == -1) {
    fVar1 = triangle->m_floats[2];
    fVar2 = triangle[1].m_floats[0];
    fVar3 = triangle[2].m_floats[2];
    fVar21 = (float)*(undefined8 *)triangle->m_floats;
    fVar22 = (float)((ulong)*(undefined8 *)triangle->m_floats >> 0x20);
    fVar17 = (float)*(undefined8 *)triangle[2].m_floats;
    fVar18 = (float)((ulong)*(undefined8 *)triangle[2].m_floats >> 0x20);
    fVar19 = (float)*(undefined8 *)(triangle[1].m_floats + 1);
    fVar20 = (float)((ulong)*(undefined8 *)(triangle[1].m_floats + 1) >> 0x20);
    fVar27 = (fVar19 - fVar22) * (fVar3 - fVar1) - (fVar18 - fVar22) * (fVar20 - fVar1);
    fVar28 = (fVar20 - fVar1) * (fVar17 - fVar21) - (fVar3 - fVar1) * (fVar2 - fVar21);
    fVar23 = (fVar18 - fVar22) * (fVar2 - fVar21) - (fVar17 - fVar21) * (fVar19 - fVar22);
    fVar26 = 1.0 / SQRT(fVar23 * fVar23 + fVar27 * fVar27 + fVar28 * fVar28);
    fVar27 = fVar26 * fVar27 * 0.06;
    fVar28 = fVar26 * fVar28 * 0.06;
    fVar23 = fVar23 * fVar26 * 0.06;
    local_98._4_4_ = fVar22 + fVar28;
    local_98._0_4_ = fVar21 + fVar27;
    local_98._8_4_ = fVar1 + fVar23;
    local_98._12_4_ = 0;
    local_88._4_4_ = fVar19 + fVar28;
    local_88._0_4_ = fVar2 + fVar27;
    local_88._8_4_ = fVar20 + fVar23;
    local_88._12_4_ = 0;
    local_78._4_4_ = fVar18 + fVar28;
    local_78._0_4_ = fVar17 + fVar27;
    local_78._8_4_ = fVar3 + fVar23;
    local_78._12_4_ = 0;
    local_68._4_4_ = fVar22 - fVar28;
    local_68._0_4_ = fVar21 - fVar27;
    local_68._8_4_ = fVar1 - fVar23;
    local_68._12_4_ = 0;
    local_58._4_4_ = fVar19 - fVar28;
    local_58._0_4_ = fVar2 - fVar27;
    local_58._8_4_ = fVar20 - fVar23;
    local_58._12_4_ = 0;
    local_48._4_4_ = fVar18 - fVar28;
    local_48._0_4_ = fVar17 - fVar27;
    local_48._8_4_ = fVar3 - fVar23;
    local_48._12_4_ = 0;
    local_100 = &this->m_shapeCache;
    this_00 = (btConvexHullShape *)btAlignedAllocInternal(0x98,0x10);
    btConvexHullShape::btConvexHullShape(this_00,(btScalar *)local_98,6,0x10);
    local_b0 = this->m_triBody;
    (this_00->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
    super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.m_userPointer =
         local_b0->m_collisionShape->m_userPointer;
    local_d8 = this->m_softBody;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (local_d8->super_btCollisionObject).m_collisionShape;
    local_e8 = auVar10 << 0x40;
    local_d0 = &(local_d8->super_btCollisionObject).m_worldTransform;
    local_c8 = 0xffffffffffffffff;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = this_00;
    local_c0 = auVar11 << 0x40;
    local_a8 = &local_b0->m_worldTransform;
    local_a0 = partId;
    local_9c = triangleIndex;
    iVar15 = (*pbVar5->_vptr_btDispatcher[2])(pbVar5,local_e8,local_c0,0);
    plVar16 = (long *)CONCAT44(extraout_var,iVar15);
    (**(code **)(*plVar16 + 0x10))
              (plVar16,local_e8,local_c0,this->m_dispatchInfoPtr,this->m_resultOut);
    (**(code **)*plVar16)(plVar16);
    (*pbVar5->_vptr_btDispatcher[0xf])(pbVar5,plVar16);
    local_f8.m_childShape = (btCollisionShape *)this_00;
    btHashMap<btHashKey<btTriIndex>,_btTriIndex>::insert(local_100,&local_104,&local_f8);
  }
  else {
    pbVar9 = pbVar8[iVar15].m_childShape;
    local_d8 = (btSoftBody *)this->m_triBody;
    pbVar9->m_userPointer = ((btCollisionObject *)local_d8)->m_collisionShape->m_userPointer;
    local_88._0_8_ = this->m_softBody;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = (((btSoftBody *)local_88._0_8_)->super_btCollisionObject).m_collisionShape;
    local_98 = auVar12 << 0x40;
    local_88._8_8_ = &(((btSoftBody *)local_88._0_8_)->super_btCollisionObject).m_worldTransform;
    local_78._0_8_ = 0xffffffffffffffff;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = pbVar9;
    local_e8 = auVar13 << 0x40;
    local_d0 = &((btCollisionObject *)local_d8)->m_worldTransform;
    local_c8 = CONCAT44(triangleIndex,partId);
    iVar15 = (*pbVar5->_vptr_btDispatcher[2])(pbVar5,local_98,local_e8,0);
    plVar16 = (long *)CONCAT44(extraout_var_00,iVar15);
    (**(code **)(*plVar16 + 0x10))
              (plVar16,local_98,local_e8,this->m_dispatchInfoPtr,this->m_resultOut);
    (**(code **)*plVar16)(plVar16);
    (*pbVar5->_vptr_btDispatcher[0xf])(pbVar5,plVar16);
  }
  return;
}

Assistant:

void btSoftBodyTriangleCallback::processTriangle(btVector3* triangle,int partId, int triangleIndex)
{
	//just for debugging purposes
	//printf("triangle %d",m_triangleCount++);
	
	btCollisionAlgorithmConstructionInfo ci;
	ci.m_dispatcher1 = m_dispatcher;

	///debug drawing of the overlapping triangles
	if (m_dispatchInfoPtr && m_dispatchInfoPtr->m_debugDraw && (m_dispatchInfoPtr->m_debugDraw->getDebugMode() &btIDebugDraw::DBG_DrawWireframe))
	{
		btVector3 color(1,1,0);
		const btTransform& tr = m_triBody->getWorldTransform();
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[0]),tr(triangle[1]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[1]),tr(triangle[2]),color);
		m_dispatchInfoPtr->m_debugDraw->drawLine(tr(triangle[2]),tr(triangle[0]),color);
	}

	btTriIndex	triIndex(partId,triangleIndex,0);
	btHashKey<btTriIndex> triKey(triIndex.getUid());


	btTriIndex* shapeIndex = m_shapeCache[triKey];
	if (shapeIndex)
	{
		btCollisionShape* tm = shapeIndex->m_childShape;
		btAssert(tm);

		//copy over user pointers to temporary shape
		tm->setUserPointer(m_triBody->getCollisionShape()->getUserPointer());

		btCollisionObjectWrapper softBody(0,m_softBody->getCollisionShape(),m_softBody,m_softBody->getWorldTransform(),-1,-1);
		//btCollisionObjectWrapper triBody(0,tm, ob, btTransform::getIdentity());//ob->getWorldTransform());//??
		btCollisionObjectWrapper triBody(0,tm, m_triBody, m_triBody->getWorldTransform(),partId, triangleIndex);

		btCollisionAlgorithm* colAlgo = ci.m_dispatcher1->findAlgorithm(&softBody,&triBody,0);//m_manifoldPtr);

		colAlgo->processCollision(&softBody,&triBody,*m_dispatchInfoPtr,m_resultOut);
		colAlgo->~btCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);
		
		return;
	}

	//aabb filter is already applied!	

	//btCollisionObject* colObj = static_cast<btCollisionObject*>(m_convexProxy->m_clientObject);

	//	if (m_softBody->getCollisionShape()->getShapeType()==
	{
		//		btVector3 other;
		btVector3 normal = (triangle[1]-triangle[0]).cross(triangle[2]-triangle[0]);
		normal.normalize();
		normal*= BT_SOFTBODY_TRIANGLE_EXTRUSION;
		//		other=(triangle[0]+triangle[1]+triangle[2])*0.333333f;
		//		other+=normal*22.f;
		btVector3	pts[6] = {triangle[0]+normal,
			triangle[1]+normal,
			triangle[2]+normal,
			triangle[0]-normal,
			triangle[1]-normal,
			triangle[2]-normal};

		btConvexHullShape* tm = new btConvexHullShape(&pts[0].getX(),6);


		//		btBU_Simplex1to4 tm(triangle[0],triangle[1],triangle[2],other);

		//btTriangleShape tm(triangle[0],triangle[1],triangle[2]);	
		//	tm.setMargin(m_collisionMarginTriangle);

		//copy over user pointers to temporary shape
		tm->setUserPointer(m_triBody->getCollisionShape()->getUserPointer());

		
		btCollisionObjectWrapper softBody(0,m_softBody->getCollisionShape(),m_softBody,m_softBody->getWorldTransform(),-1,-1);
		btCollisionObjectWrapper triBody(0,tm, m_triBody, m_triBody->getWorldTransform(),partId, triangleIndex);//btTransform::getIdentity());//??

		btCollisionAlgorithm* colAlgo = ci.m_dispatcher1->findAlgorithm(&softBody,&triBody,0);//m_manifoldPtr);

		colAlgo->processCollision(&softBody,&triBody,*m_dispatchInfoPtr,m_resultOut);
		colAlgo->~btCollisionAlgorithm();
		ci.m_dispatcher1->freeCollisionAlgorithm(colAlgo);

		triIndex.m_childShape = tm;
		m_shapeCache.insert(triKey,triIndex);

	}



}